

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_parse_same_option_twice_string_with_unique(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *s;
  cargo_t cargo;
  int i;
  char *args [7];
  cargo_t local_58;
  undefined1 local_4c [4];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  char *pcStack_20;
  char *local_18;
  
  iVar1 = cargo_init(&local_58,0,"program");
  if (iVar1 == 0) {
    local_18 = "def";
    local_28 = "4";
    pcStack_20 = "--alpha";
    local_38 = "abc";
    pcStack_30 = "--beta";
    local_48 = 0x12ab1a;
    uStack_44 = 0;
    uStack_40 = 0x127e2d;
    uStack_3c = 0;
    iVar1 = cargo_add_option(local_58,CARGO_OPT_UNIQUE,"--alpha -a","The alpha","s");
    iVar2 = cargo_add_option(local_58,0,"--beta -b","The beta","i",local_4c);
    if (iVar2 == 0 && iVar1 == 0) {
      iVar1 = cargo_parse(local_58,0,1,7,(char **)&local_48);
      printf("--alpha = %s\n",0);
      if (iVar1 == 0) {
        pcVar3 = "Succesfully parsed duplicate option";
      }
      else {
        pcVar3 = (char *)0x0;
      }
    }
    else {
      pcVar3 = "Failed to add options";
    }
    cargo_destroy(&local_58);
  }
  else {
    pcVar3 = "Failed to init cargo";
  }
  return pcVar3;
}

Assistant:

_TEST_START(TEST_parse_same_option_twice_string_with_unique)
{
    char *s = NULL;
    int i;
    char *args[] = { "program", "--alpha", "abc", "--beta", "4", "--alpha", "def" };

    ret |= cargo_add_option(cargo, CARGO_OPT_UNIQUE,
                            "--alpha -a", "The alpha", "s", &s);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &i);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("--alpha = %s\n", s);
    cargo_assert(ret != 0, "Succesfully parsed duplicate option");
    cargo_assert(s == NULL, "Expected --alpha to have value NULL");

    _TEST_CLEANUP();
    _cargo_xfree(&s);
}